

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O0

wchar_t pick_one_chest_trap(wchar_t level)

{
  chest_trap *local_20;
  chest_trap *trap;
  uint32_t local_10;
  wchar_t pick;
  wchar_t count;
  wchar_t level_local;
  
  local_10 = 0;
  for (local_20 = chest_traps->next; local_20 != (chest_trap *)0x0; local_20 = local_20->next) {
    if (local_20->level <= level) {
      local_10 = local_10 + 1;
    }
  }
  trap._4_4_ = Rand_div(local_10);
  local_20 = chest_traps->next;
  while ((local_20 != (chest_trap *)0x0 && (trap._4_4_ != 0))) {
    local_20 = local_20->next;
    trap._4_4_ = trap._4_4_ - 1;
  }
  return local_20->pval;
}

Assistant:

static int pick_one_chest_trap(int level)
{
	int count = 0, pick;
	struct chest_trap *trap;

	/* Count possible traps (starting after the "locked" trap) */
	for (trap = chest_traps->next; trap; trap = trap->next) {
		if (trap->level <= level) count++;
	}

	/* Pick a trap, return the pval */
	pick = randint0(count);
	for (trap = chest_traps->next; trap; trap = trap->next) {
		if (!pick--) break;
	}
	return trap->pval;
}